

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::has_parent_path(Twine *path,Style style)

{
  Style style_00;
  StringRef SVar1;
  StringRef path_00;
  SmallString<128U> path_storage;
  SmallVectorImpl<char> local_a0;
  undefined1 local_90 [128];
  
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_90;
  style_00 = windows;
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  SVar1 = Twine::toStringRef(path,&local_a0);
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)SVar1.Length;
  path_00.Length._4_4_ = 0;
  SVar1 = parent_path((path *)SVar1.Data,path_00,style_00);
  SmallVectorImpl<char>::~SmallVectorImpl(&local_a0);
  return SVar1.Length != 0;
}

Assistant:

bool has_parent_path(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !parent_path(p, style).empty();
}